

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int __thiscall QObject::receivers(QObject *this,char *signal)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QObjectPrivate *pQVar6;
  Type pCVar7;
  Type this_00;
  Type pQVar8;
  long in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Connection *c;
  ConnectionData *cd;
  int signal_index;
  int receivers;
  QObjectPrivate *d;
  QByteArray signal_name;
  QMutexLocker<QBasicMutex> locker;
  QBasicMutex *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff53;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  Type local_88;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar9;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QObject *)0x3efd3e);
  iVar9 = 0;
  if (in_RSI != 0) {
    QMetaObject::normalizedSignature(in_stack_ffffffffffffff80);
    QByteArray::operator_cast_to_char_((QByteArray *)0x3efda2);
    iVar3 = QObjectPrivate::signalIndex
                      ((QObjectPrivate *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98,
                       (QMetaObject **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
    if (iVar3 < 0) {
      local_3c = 0;
      bVar2 = true;
    }
    else {
      bVar2 = QObjectPrivate::isSignalConnected
                        ((QObjectPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff54,(bool)in_stack_ffffffffffffff53);
      if (bVar2) {
        if ((((*(uint *)&(pQVar6->super_QObjectData).field_0x30 >> 3 & 1) == 0) &&
            ((pQVar6->field_3).currentChildBeingDeleted != (QObject *)0x0)) &&
           (QAbstractDeclarativeData::receivers !=
            (_func_int_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0)) {
          iVar4 = (*QAbstractDeclarativeData::receivers)
                            ((QAbstractDeclarativeData *)(pQVar6->field_3).currentChildBeingDeleted,
                             in_RDI,iVar3);
          iVar9 = iVar4 + iVar9;
        }
        signalSlotLock(in_RDI);
        QMutexLocker<QBasicMutex>::QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28);
        pCVar7 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                           ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3eff0c);
        if ((pCVar7 != (Type)0x0) &&
           (iVar4 = iVar3,
           iVar5 = QObjectPrivate::ConnectionData::signalVectorCount
                             ((ConnectionData *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)),
           iVar3 < iVar5)) {
          this_00 = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                              ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3eff53);
          QObjectPrivate::SignalVector::at(this_00,iVar4);
          local_88 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                               ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eff70);
          while (local_88 != (Type)0x0) {
            pQVar8 = QBasicAtomicPointer<QObject>::loadRelaxed
                               ((QBasicAtomicPointer<QObject> *)0x3eff8b);
            iVar9 = (uint)(pQVar8 != (Type)0x0) + iVar9;
            local_88 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                 ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3effb2);
          }
        }
        QMutexLocker<QBasicMutex>::~QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        bVar2 = false;
      }
      else {
        bVar2 = true;
        local_3c = iVar9;
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x3efffe);
    if (bVar2) goto LAB_003f0026;
  }
  local_3c = iVar9;
LAB_003f0026:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::receivers(const char *signal) const
{
    Q_D(const QObject);
    int receivers = 0;
    if (signal) {
        QByteArray signal_name = QMetaObject::normalizedSignature(signal);
        signal = signal_name;
#ifndef QT_NO_DEBUG
        if (!check_signal_macro(this, signal, "receivers", "bind"))
            return 0;
#endif
        signal++; // skip code
        int signal_index = d->signalIndex(signal);
        if (signal_index < 0) {
#ifndef QT_NO_DEBUG
            err_method_notfound(this, signal - 1, "receivers");
#endif
            return 0;
        }

        if (!d->isSignalConnected(signal_index))
            return receivers;

        if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::receivers) {
            receivers += QAbstractDeclarativeData::receivers(d->declarativeData, this,
                                                             signal_index);
        }

        QMutexLocker locker(signalSlotLock(this));
        QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
        if (cd && signal_index < cd->signalVectorCount()) {
            const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();
            while (c) {
                receivers += c->receiver.loadRelaxed() ? 1 : 0;
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    }
    return receivers;
}